

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Disa::level_traversal<Disa::Adjacency_Graph<false>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Disa *this,
          Adjacency_Graph<false> *graph,size_t i_start,size_t end_level)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  Adjacency_Graph<false> *__n;
  unsigned_long __val;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> vertex_queue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  string local_50;
  undefined **local_30;
  
  uVar4 = *(long *)(this + 0x20) - *(long *)(this + 0x18);
  if ((uVar4 == 0) || (uVar4 < 9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_f8._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)&PTR_s__workspace_llm4binary_github_lic_00164570;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
               (Disa *)0x0,(Log_Level)&local_f8,(source_location *)i_start);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_a0._M_impl.super__Deque_impl_data._M_map
                        ,local_a0._M_impl.super__Deque_impl_data._M_map_size);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Graph is empty.",0xf);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    __n = (Adjacency_Graph<false> *)(((long)uVar4 >> 3) + -1);
    if (graph < __n) {
      local_a0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (__return_storage_ptr__,(size_type)__n,(value_type_conflict *)&local_a0,
                 (allocator_type *)&local_f8);
      local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_118._M_dataplus._M_p = (pointer)graph;
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_range_initialize<unsigned_long_const*>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,&local_118);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_Deque_base
                (&local_a0,&local_f8);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_f8);
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_start[(long)graph] = 0;
      level_traversal<Disa::Adjacency_Graph<false>>
                ((Adjacency_Graph<false> *)this,
                 (queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&local_a0,__return_storage_ptr__,i_start);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_a0);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_30 = &PTR_s__workspace_llm4binary_github_lic_00164588;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
               (Disa *)0x0,(Log_Level)&local_30,(source_location *)i_start);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_a0._M_impl.super__Deque_impl_data._M_map
                        ,local_a0._M_impl.super__Deque_impl_data._M_map_size);
    __val = 0;
    if (*(long *)(this + 0x20) != *(long *)(this + 0x18)) {
      __val = (*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3) - 1;
    }
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&local_118,"Starting vertex not in range (0, ",&local_50);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_118,"].");
    local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_impl.super__Deque_impl_data._M_map == paVar3) {
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)paVar3->_M_allocated_capacity;
      local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
           *(_Elt_pointer *)((long)&pbVar2->field_2 + 8);
      local_f8._M_impl.super__Deque_impl_data._M_map =
           &local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
    }
    else {
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)paVar3->_M_allocated_capacity;
    }
    local_f8._M_impl.super__Deque_impl_data._M_map_size = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(char *)local_f8._M_impl.super__Deque_impl_data._M_map,
                        local_f8._M_impl.super__Deque_impl_data._M_map_size);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  exit(1);
}

Assistant:

std::vector<std::size_t> level_traversal(const _graph& graph, const std::size_t i_start,
                                         const std::size_t end_level = std::numeric_limits<std::size_t>::max()) {

  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(),
               "Starting vertex not in range (0, " + std::to_string(graph.size_vertex()) + "].");

  std::vector<std::size_t> vertex_level(graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  std::queue<std::size_t> vertex_queue({i_start});
  vertex_level[i_start] = 0;
  level_traversal(graph, vertex_queue, vertex_level, end_level);
  return vertex_level;
}